

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImDrawList *pIVar1;
  float *pfVar2;
  ImGuiNavMoveResult *pIVar3;
  bool *pbVar4;
  int *piVar5;
  ImVec2 *pIVar6;
  float fVar7;
  ImGuiID IVar8;
  ImGuiInputSource IVar9;
  ImGuiID IVar10;
  ImFontAtlas *pIVar11;
  ImGuiWindow **ppIVar12;
  ImGuiPopupData *pIVar13;
  ImVec2 IVar14;
  ImVec2 IVar15;
  ImVec2 IVar16;
  ImGuiContext *pIVar17;
  ImGuiContext *pIVar18;
  ImGuiContext *pIVar19;
  bool bVar20;
  bool bVar21;
  int i;
  int iVar22;
  int iVar23;
  long lVar24;
  ImGuiWindow *pIVar25;
  ImGuiWindow **__dest;
  ImGuiPopupData *__dest_00;
  int i_1;
  ImGuiWindow *window;
  char *pcVar26;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar27;
  ulong uVar28;
  byte bVar29;
  ImGuiNavMoveResult *pIVar30;
  float *pfVar31;
  ulong uVar32;
  ImGuiNavLayer IVar33;
  ImFont *font;
  float *pfVar34;
  byte bVar35;
  undefined8 unaff_R12;
  ImGuiContext *g_1;
  ImGuiContext *pIVar36;
  ImGuiContext *g;
  bool bVar37;
  uint uVar38;
  uint uVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  ImVec2 IVar43;
  ImVec2 IVar44;
  ImVec2 IVar45;
  double dVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  ImVec2 IVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  ImRect rect_abs;
  ImRect local_60;
  ImGuiWindow *local_50;
  ulong local_48;
  ImRect local_40;
  
  pIVar17 = GImGui;
  bVar29 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd61,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6a,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6b,"void ImGui::NewFrame()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6c,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6d,"void ImGui::NewFrame()");
  }
  pIVar11 = (GImGui->IO).Fonts;
  if ((pIVar11->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6e,"void ImGui::NewFrame()");
  }
  if ((*(pIVar11->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd6f,"void ImGui::NewFrame()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd70,"void ImGui::NewFrame()");
  }
  fVar40 = (GImGui->Style).Alpha;
  if ((fVar40 < 0.0) || (1.0 < fVar40)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd71,"void ImGui::NewFrame()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd72,"void ImGui::NewFrame()");
  }
  lVar24 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar24] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0xd74,"void ImGui::NewFrame()");
    }
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x15);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd78,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar17->SettingsLoaded == false) {
    if ((pIVar17->SettingsWindows).Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0xd81,"void ImGui::NewFrame()");
    }
    pcVar26 = (pIVar17->IO).IniFilename;
    if (pcVar26 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar26);
    }
    pIVar17->SettingsLoaded = true;
  }
  if ((0.0 < pIVar17->SettingsDirtyTimer) &&
     (fVar40 = pIVar17->SettingsDirtyTimer - (pIVar17->IO).DeltaTime,
     pIVar17->SettingsDirtyTimer = fVar40, fVar40 <= 0.0)) {
    pcVar26 = (pIVar17->IO).IniFilename;
    if (pcVar26 == (char *)0x0) {
      (pIVar17->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar26);
    }
    pIVar17->SettingsDirtyTimer = 0.0;
  }
  pIVar17->Time = (double)(pIVar17->IO).DeltaTime + pIVar17->Time;
  pIVar17->FrameScopeActive = true;
  pIVar17->FrameCount = pIVar17->FrameCount + 1;
  pIVar17->TooltipOverrideCount = 0;
  pIVar17->WindowsActiveCount = 0;
  ((pIVar17->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar11 = (GImGui->IO).Fonts;
    if ((pIVar11->Fonts).Size < 1) {
      pcVar26 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_001227eb:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.h"
                    ,0x4d7,pcVar26);
    }
    font = *(pIVar11->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar17->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xd9e,"void ImGui::NewFrame()");
  }
  fVar40 = (pIVar17->IO).DisplaySize.x;
  fVar48 = (pIVar17->IO).DisplaySize.y;
  (pIVar17->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar17->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar17->DrawListSharedData).ClipRectFullscreen.z = fVar40;
  (pIVar17->DrawListSharedData).ClipRectFullscreen.w = fVar48;
  (pIVar17->DrawListSharedData).CurveTessellationTol = (pIVar17->Style).CurveTessellationTol;
  pIVar1 = &pIVar17->BackgroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar17->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar17->BackgroundDrawList).Flags =
       (uint)(pIVar17->Style).AntiAliasedLines + (uint)(pIVar17->Style).AntiAliasedFill * 2;
  pIVar1 = &pIVar17->ForegroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar17->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar17->ForegroundDrawList).Flags =
       (uint)(pIVar17->Style).AntiAliasedLines + (uint)(pIVar17->Style).AntiAliasedFill * 2;
  (pIVar17->DrawData).Valid = false;
  (pIVar17->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar17->DrawData).CmdListsCount = 0;
  (pIVar17->DrawData).TotalIdxCount = 0;
  (pIVar17->DrawData).TotalVtxCount = 0;
  (pIVar17->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar17->DrawData).DisplayPos.y = 0;
  (pIVar17->DrawData).DisplaySize.x = 0.0;
  (pIVar17->DrawData).DisplaySize.y = 0.0;
  (pIVar17->DrawData).FramebufferScale.x = 0.0;
  pIVar18 = GImGui;
  (pIVar17->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar17->DragDropActive == true) &&
     (IVar8 = (pIVar17->DragDropPayload).SourceId, IVar8 == pIVar17->ActiveId)) {
    if (GImGui->ActiveId == IVar8) {
      GImGui->ActiveIdIsAlive = IVar8;
    }
    if (pIVar18->ActiveIdPreviousFrame == IVar8) {
      pIVar18->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar17->HoveredIdPreviousFrame == 0) {
    pIVar17->HoveredIdTimer = 0.0;
LAB_00120088:
    pIVar17->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar17->HoveredId != 0) && (pIVar17->ActiveId == pIVar17->HoveredId))
  goto LAB_00120088;
  IVar8 = pIVar17->HoveredId;
  if ((IVar8 != 0) &&
     (pIVar17->HoveredIdTimer = (pIVar17->IO).DeltaTime + pIVar17->HoveredIdTimer,
     pIVar17->ActiveId != IVar8)) {
    pIVar17->HoveredIdNotActiveTimer = (pIVar17->IO).DeltaTime + pIVar17->HoveredIdNotActiveTimer;
  }
  pIVar17->HoveredIdPreviousFrame = IVar8;
  pIVar17->HoveredId = 0;
  pIVar17->HoveredIdAllowOverlap = false;
  pIVar18 = GImGui;
  IVar8 = pIVar17->ActiveId;
  if (((pIVar17->ActiveIdIsAlive != IVar8) && (IVar8 != 0)) &&
     (pIVar17->ActiveIdPreviousFrame == IVar8)) {
    bVar37 = GImGui->ActiveId != 0;
    GImGui->ActiveIdIsJustActivated = bVar37;
    if (bVar37) {
      pIVar18->ActiveIdTimer = 0.0;
      pIVar18->ActiveIdHasBeenPressed = false;
      pIVar18->ActiveIdHasBeenEdited = false;
    }
    pIVar18->ActiveId = 0;
    pIVar18->ActiveIdAllowNavDirFlags = 0;
    pIVar18->ActiveIdBlockNavInputFlags = 0;
    pIVar18->ActiveIdAllowOverlap = false;
    pIVar18->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  IVar8 = pIVar17->ActiveId;
  if (IVar8 != 0) {
    pIVar17->ActiveIdTimer = (pIVar17->IO).DeltaTime + pIVar17->ActiveIdTimer;
  }
  pIVar17->LastActiveIdTimer = (pIVar17->IO).DeltaTime + pIVar17->LastActiveIdTimer;
  pIVar17->ActiveIdPreviousFrame = IVar8;
  pIVar17->ActiveIdPreviousFrameWindow = pIVar17->ActiveIdWindow;
  pIVar17->ActiveIdPreviousFrameHasBeenEdited = pIVar17->ActiveIdHasBeenEdited;
  pIVar17->ActiveIdIsAlive = 0;
  pIVar17->ActiveIdPreviousFrameIsAlive = false;
  pIVar17->ActiveIdIsJustActivated = false;
  if (IVar8 != pIVar17->TempInputTextId && pIVar17->TempInputTextId != 0) {
    pIVar17->TempInputTextId = 0;
  }
  pIVar17->DragDropAcceptIdPrev = pIVar17->DragDropAcceptIdCurr;
  pIVar17->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar17->DragDropAcceptIdCurr = 0;
  pIVar17->DragDropWithinSourceOrTarget = false;
  pfVar2 = (pIVar17->IO).KeysDownDuration;
  memcpy((pIVar17->IO).KeysDownDurationPrev,pfVar2,0x800);
  lVar24 = 0;
  do {
    fVar40 = -1.0;
    if ((pIVar17->IO).KeysDown[lVar24] == true) {
      fVar40 = 0.0;
      if (0.0 <= pfVar2[lVar24]) {
        fVar40 = pfVar2[lVar24] + (pIVar17->IO).DeltaTime;
      }
    }
    pfVar2[lVar24] = fVar40;
    pIVar18 = GImGui;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x200);
  (GImGui->IO).WantSetMousePos = false;
  uVar38 = (pIVar18->IO).ConfigFlags;
  if ((uVar38 & 2) == 0) {
    pIVar36 = (ImGuiContext *)0x0;
  }
  else {
    pIVar36 = (ImGuiContext *)
              (CONCAT71((int7)((ulong)unaff_R12 >> 8),(char)(pIVar18->IO).BackendFlags) &
              0xffffffffffffff01);
  }
  bVar35 = (byte)pIVar36;
  if ((bVar35 != 0) &&
     (((0.0 < (pIVar18->IO).NavInputs[0] || (0.0 < (pIVar18->IO).NavInputs[2])) ||
      ((0.0 < (pIVar18->IO).NavInputs[1] || (0.0 < (pIVar18->IO).NavInputs[3])))))) {
    pIVar18->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar38 & 1) != 0) {
    iVar23 = (pIVar18->IO).KeyMap[0xc];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_001227f5;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[0] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[0xd];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_001227f5;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[2] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[0xe];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_001227f5;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[1] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[1];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_001227f5;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[0x12] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[2];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_001227f5;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[0x13] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[3];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_001227f5;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[0x14] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[4];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) goto LAB_001227f5;
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[0x15] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar23 = (pIVar18->IO).KeyMap[0];
    if (-1 < (long)iVar23) {
      if (0x1ff < iVar23) {
LAB_001227f5:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(GImGui->IO.KeysDown)/sizeof(*GImGui->IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                      ,0x1022,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar18->IO).KeysDown[iVar23] == true) {
        (pIVar18->IO).NavInputs[0x11] = 1.0;
        pIVar18->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar37 = (pIVar18->IO).KeyCtrl;
    if (bVar37 == true) {
      (pIVar18->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar18->IO).KeyShift == true) {
      (pIVar18->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar37 == false) && ((pIVar18->IO).KeyAlt != false)) {
      (pIVar18->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar2 = (pIVar18->IO).NavInputsDownDuration;
  pfVar31 = pfVar2;
  pfVar34 = (pIVar18->IO).NavInputsDownDurationPrev;
  for (lVar24 = 0xb; lVar24 != 0; lVar24 = lVar24 + -1) {
    *(undefined8 *)pfVar34 = *(undefined8 *)pfVar31;
    pfVar31 = pfVar31 + (ulong)bVar29 * -4 + 2;
    pfVar34 = pfVar34 + (ulong)bVar29 * -4 + 2;
  }
  lVar24 = 0;
  do {
    fVar40 = -1.0;
    if (0.0 < (pIVar18->IO).NavInputs[lVar24]) {
      fVar40 = 0.0;
      if (0.0 <= pfVar2[lVar24]) {
        fVar40 = pfVar2[lVar24] + (pIVar18->IO).DeltaTime;
      }
    }
    pfVar2[lVar24] = fVar40;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x16);
  IVar8 = pIVar18->NavInitResultId;
  if ((IVar8 != 0) &&
     ((pIVar18->NavDisableHighlight != true || (pIVar18->NavInitRequestFromMove == true)))) {
    if (pIVar18->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1e8f,"void ImGui::NavUpdate()");
    }
    IVar33 = pIVar18->NavLayer;
    if (pIVar18->NavInitRequestFromMove == true) {
      SetNavID(IVar8,IVar33);
      IVar43 = (pIVar18->NavInitResultRectRel).Max;
      pIVar6 = &pIVar18->NavWindow->NavRectRel[(int)IVar33].Min;
      *pIVar6 = (pIVar18->NavInitResultRectRel).Min;
      pIVar6[1] = IVar43;
      pIVar18->NavMousePosDirty = true;
      pIVar18->NavDisableHighlight = false;
      pIVar18->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar8,IVar33);
    }
    IVar43 = (pIVar18->NavInitResultRectRel).Max;
    pIVar6 = &pIVar18->NavWindow->NavRectRel[pIVar18->NavLayer].Min;
    *pIVar6 = (pIVar18->NavInitResultRectRel).Min;
    pIVar6[1] = IVar43;
  }
  pIVar18->NavInitRequest = false;
  pIVar18->NavInitRequestFromMove = false;
  pIVar18->NavInitResultId = 0;
  pIVar18->NavJustMovedToId = 0;
  pIVar19 = GImGui;
  if (pIVar18->NavMoveRequest == true) {
    IVar8 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar8 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar19->NavDisableHighlight = false;
        pIVar19->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar3 = &GImGui->NavMoveResultOther;
      pIVar30 = &GImGui->NavMoveResultLocal;
      if (IVar8 == 0) {
        pIVar30 = pIVar3;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20) != 0) &&
          (IVar8 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar8 != 0)) &&
         (IVar8 != GImGui->NavId)) {
        pIVar30 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (((pIVar30 != pIVar3) && (pIVar3->ID != 0)) &&
         (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar40 = (GImGui->NavMoveResultOther).DistBox;
        fVar48 = pIVar30->DistBox;
        if (fVar48 <= fVar40) {
          if (((fVar40 != fVar48) || (NAN(fVar40) || NAN(fVar48))) ||
             (pfVar2 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar30->DistCenter < *pfVar2 || pIVar30->DistCenter == *pfVar2)) goto LAB_001206a6;
        }
        pIVar30 = pIVar3;
      }
LAB_001206a6:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) || (pIVar30->Window == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                      ,0x1f93,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        fVar40 = (pIVar30->Window->Pos).x;
        fVar48 = (pIVar30->Window->Pos).y;
        local_60.Min.x = (pIVar30->RectRel).Min.x + fVar40;
        local_60.Max.x = fVar40 + (pIVar30->RectRel).Max.x;
        local_60.Min.y = (pIVar30->RectRel).Min.y + fVar48;
        local_60.Max.y = fVar48 + (pIVar30->RectRel).Max.y;
        NavScrollToBringItemIntoView(pIVar30->Window,&local_60);
        pIVar25 = pIVar30->Window;
        IVar43 = CalcNextScrollFromScrollTargetAndClamp(pIVar25,false);
        fVar40 = (pIVar25->Scroll).x - IVar43.x;
        fVar48 = (pIVar25->Scroll).y - IVar43.y;
        (pIVar30->RectRel).Min.x = (pIVar30->RectRel).Min.x + fVar40;
        (pIVar30->RectRel).Min.y = (pIVar30->RectRel).Min.y + fVar48;
        (pIVar30->RectRel).Max.x = (pIVar30->RectRel).Max.x + fVar40;
        (pIVar30->RectRel).Max.y = (pIVar30->RectRel).Max.y + fVar48;
        if ((pIVar25->Flags & 0x1000000) != 0) {
          local_40.Min.x = local_60.Min.x + fVar40;
          local_40.Min.y = local_60.Min.y + fVar48;
          local_40.Max.y = fVar48 + local_60.Max.y;
          local_40.Max.x = fVar40 + local_60.Max.x;
          NavScrollToBringItemIntoView(pIVar25->ParentWindow,&local_40);
        }
      }
      pIVar36 = GImGui;
      bVar37 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar37;
      if (bVar37) {
        pIVar36->ActiveIdTimer = 0.0;
        pIVar36->ActiveIdHasBeenPressed = false;
        pIVar36->ActiveIdHasBeenEdited = false;
      }
      pIVar36->ActiveId = 0;
      pIVar36->ActiveIdAllowNavDirFlags = 0;
      pIVar36->ActiveIdBlockNavInputFlags = 0;
      pIVar36->ActiveIdAllowOverlap = false;
      pIVar36->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar19->NavWindow = pIVar30->Window;
      IVar8 = pIVar30->ID;
      if (pIVar19->NavId != IVar8) {
        pIVar19->NavJustMovedToId = IVar8;
        pIVar19->NavJustMovedToMultiSelectScopeId = pIVar30->SelectScopeId;
      }
      IVar33 = pIVar19->NavLayer;
      SetNavID(IVar8,IVar33);
      IVar43 = (pIVar30->RectRel).Max;
      pIVar6 = &pIVar36->NavWindow->NavRectRel[(int)IVar33].Min;
      *pIVar6 = (pIVar30->RectRel).Min;
      pIVar6[1] = IVar43;
      pIVar36->NavMousePosDirty = true;
      pIVar36->NavDisableHighlight = false;
      pIVar36->NavDisableMouseHover = true;
      pIVar19->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar18->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar18->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1ea2,"void ImGui::NavUpdate()");
    }
    if (((pIVar18->NavMoveResultLocal).ID == 0) && ((pIVar18->NavMoveResultOther).ID == 0)) {
      pIVar18->NavDisableHighlight = false;
    }
    pIVar18->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar18->NavMousePosDirty == true) && (pIVar18->NavIdIsAlive == true)) {
    if ((((pIVar18->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar18->IO).BackendFlags & 4) != 0 && (pIVar18->NavDisableHighlight == false)) &&
         (pIVar18->NavDisableMouseHover == true)) && (pIVar18->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar43 = NavCalcPreferredRefPos();
      (pIVar18->IO).MousePosPrev = IVar43;
      (pIVar18->IO).MousePos = IVar43;
      (pIVar18->IO).WantSetMousePos = true;
    }
    pIVar18->NavMousePosDirty = false;
  }
  pIVar18->NavIdIsAlive = false;
  pIVar18->NavJustTabbedId = 0;
  IVar33 = pIVar18->NavLayer;
  if (ImGuiNavLayer_Menu < IVar33) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x1eb8,"void ImGui::NavUpdate()");
  }
  pIVar25 = pIVar18->NavWindow;
  pIVar27 = pIVar25;
  if (pIVar25 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar27->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar27 != pIVar25) {
          pIVar27->NavLastChildNavWindow = pIVar25;
        }
        break;
      }
      ppIVar12 = &pIVar27->ParentWindow;
      pIVar27 = *ppIVar12;
    } while (*ppIVar12 != (ImGuiWindow *)0x0);
    if (((pIVar25 != (ImGuiWindow *)0x0) && (IVar33 == ImGuiNavLayer_Main)) &&
       (pIVar25->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar25->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar19 = GImGui;
  pIVar25 = GetFrontMostPopupModal();
  if (pIVar25 == (ImGuiWindow *)0x0) {
    if ((pIVar19->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
       (pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0)) {
      fVar40 = (pIVar19->IO).DeltaTime * -10.0 + pIVar19->NavWindowingHighlightAlpha;
      fVar40 = (float)(-(uint)(0.0 <= fVar40) & (uint)fVar40);
      pIVar19->NavWindowingHighlightAlpha = fVar40;
      if ((pIVar19->DimBgRatio <= 0.0) && (fVar40 <= 0.0)) {
        pIVar19->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
      }
    }
    if (pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar37 = (pIVar19->IO).NavInputsDownDuration[3] == 0.0;
      if ((((pIVar19->IO).KeyCtrl != true) || (iVar23 = (pIVar19->IO).KeyMap[0], iVar23 < 0)) ||
         (bVar20 = IsKeyPressed(iVar23,true), !bVar20)) goto LAB_00120a6b;
      bVar29 = (byte)(pIVar19->IO).ConfigFlags & 1;
    }
    else {
      bVar37 = false;
LAB_00120a6b:
      bVar29 = 0;
    }
    if (bVar37 || bVar29 != 0) {
      pIVar25 = pIVar19->NavWindow;
      if (pIVar25 == (ImGuiWindow *)0x0) {
        pIVar25 = FindWindowNavFocusable((pIVar19->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
      }
      if (pIVar25 != (ImGuiWindow *)0x0) {
        pIVar19->NavWindowingTargetAnim = pIVar25;
        pIVar19->NavWindowingTarget = pIVar25;
        pIVar19->NavWindowingTimer = 0.0;
        pIVar19->NavWindowingHighlightAlpha = 0.0;
        pIVar19->NavWindowingToggleLayer = (bool)(bVar29 ^ 1);
        pIVar19->NavInputSource = ImGuiInputSource_NavGamepad - bVar29;
      }
    }
    fVar40 = (pIVar19->IO).DeltaTime + pIVar19->NavWindowingTimer;
    pIVar19->NavWindowingTimer = fVar40;
    if ((pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0) ||
       (pIVar19->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_00120bbd:
      uVar28 = 0;
      pIVar25 = (ImGuiWindow *)0x0;
    }
    else {
      fVar48 = (fVar40 + -0.2) / 0.05;
      fVar40 = 1.0;
      if (fVar48 <= 1.0) {
        fVar40 = fVar48;
      }
      fVar40 = (float)(~-(uint)(fVar48 < 0.0) & (uint)fVar40);
      uVar39 = -(uint)(fVar40 <= pIVar19->NavWindowingHighlightAlpha);
      pIVar19->NavWindowingHighlightAlpha =
           (float)(uVar39 & (uint)pIVar19->NavWindowingHighlightAlpha | ~uVar39 & (uint)fVar40);
      fVar40 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar48 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar23 = (uint)(0.0 < fVar40) - (uint)(0.0 < fVar48);
      if (iVar23 != 0) {
        NavUpdateWindowingHighlightWindow(iVar23);
        pIVar19->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_00120bbd;
      pbVar4 = &pIVar19->NavWindowingToggleLayer;
      *pbVar4 = (bool)(*pbVar4 &
                      (pIVar19->NavWindowingHighlightAlpha <= 1.0 &&
                      pIVar19->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar4 == false) {
        pIVar25 = pIVar19->NavWindowingTarget;
        uVar28 = 0;
      }
      else {
        uVar28 = CONCAT71((int7)((ulong)pIVar36 >> 8),pIVar19->NavWindow != (ImGuiWindow *)0x0);
        pIVar25 = (ImGuiWindow *)0x0;
      }
      pIVar19->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((pIVar19->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (pIVar19->NavInputSource == ImGuiInputSource_NavKeyboard)) {
      fVar48 = (pIVar19->NavWindowingTimer + -0.2) / 0.05;
      fVar40 = 1.0;
      if (fVar48 <= 1.0) {
        fVar40 = fVar48;
      }
      fVar40 = (float)(~-(uint)(fVar48 < 0.0) & (uint)fVar40);
      uVar39 = -(uint)(fVar40 <= pIVar19->NavWindowingHighlightAlpha);
      pIVar19->NavWindowingHighlightAlpha =
           (float)(uVar39 & (uint)pIVar19->NavWindowingHighlightAlpha | ~uVar39 & (uint)fVar40);
      iVar23 = (GImGui->IO).KeyMap[0];
      if ((-1 < iVar23) && (bVar37 = IsKeyPressed(iVar23,true), bVar37)) {
        NavUpdateWindowingHighlightWindow((pIVar19->IO).KeyShift - 1 | 1);
      }
      if ((pIVar19->IO).KeyCtrl == false) {
        pIVar25 = pIVar19->NavWindowingTarget;
      }
    }
    pIVar36 = GImGui;
    fVar40 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar40 == 0.0) && (!NAN(fVar40))) {
      pIVar19->NavWindowingToggleLayer = true;
    }
    if ((((pIVar19->ActiveId == 0) || (pIVar19->ActiveIdAllowOverlap == true)) && (fVar40 < 0.0)) &&
       ((pIVar19->NavWindowingToggleLayer != false &&
        (0.0 <= (pIVar36->IO).NavInputsDownDurationPrev[0x10])))) {
      bVar37 = IsMousePosValid(&(pIVar19->IO).MousePos);
      bVar20 = IsMousePosValid(&(pIVar19->IO).MousePosPrev);
      uVar39 = (uint)uVar28;
      uVar28 = 1;
      if (bVar20 != bVar37) {
        uVar28 = (ulong)(uVar39 & 0xff);
      }
    }
    pIVar27 = pIVar19->NavWindowingTarget;
    if ((pIVar27 != (ImGuiWindow *)0x0) && (uVar39 = pIVar27->Flags, (uVar39 & 4) == 0)) {
      IVar9 = pIVar19->NavInputSource;
      IVar43.x = 0.0;
      IVar43.y = 0.0;
      local_48 = uVar28;
      if ((IVar9 == ImGuiInputSource_NavKeyboard) && ((pIVar19->IO).KeyShift == false)) {
        local_50 = pIVar25;
        IVar43 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
        pIVar25 = local_50;
      }
      if (IVar9 == ImGuiInputSource_NavGamepad) {
        IVar43 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar40 = IVar43.y;
      uVar28 = local_48;
      if (((IVar43.x != 0.0) || (fVar40 != 0.0)) || (NAN(fVar40))) {
        fVar48 = (pIVar19->IO).DisplayFramebufferScale.x;
        fVar41 = (pIVar19->IO).DisplayFramebufferScale.y;
        if (fVar41 <= fVar48) {
          fVar48 = fVar41;
        }
        fVar48 = (float)(int)(fVar48 * (pIVar19->IO).DeltaTime * 800.0);
        pIVar27 = pIVar27->RootWindow;
        (pIVar27->Pos).x = IVar43.x * fVar48 + (pIVar27->Pos).x;
        (pIVar27->Pos).y = fVar40 * fVar48 + (pIVar27->Pos).y;
        pIVar19->NavDisableMouseHover = true;
        if (((uVar39 >> 8 & 1) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    pIVar36 = GImGui;
    if (pIVar25 != (ImGuiWindow *)0x0) {
      if ((pIVar19->NavWindow == (ImGuiWindow *)0x0) || (pIVar25 != pIVar19->NavWindow->RootWindow))
      {
        bVar37 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar37;
        if (bVar37) {
          pIVar36->ActiveIdTimer = 0.0;
          pIVar36->ActiveIdHasBeenPressed = false;
          pIVar36->ActiveIdHasBeenEdited = false;
        }
        pIVar36->ActiveId = 0;
        pIVar36->ActiveIdAllowNavDirFlags = 0;
        pIVar36->ActiveIdBlockNavInputFlags = 0;
        pIVar36->ActiveIdAllowOverlap = false;
        pIVar36->ActiveIdWindow = (ImGuiWindow *)0x0;
        pIVar19->NavDisableHighlight = false;
        pIVar19->NavDisableMouseHover = true;
        pIVar27 = pIVar25->NavLastChildNavWindow;
        if (pIVar25->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar27 = pIVar25;
        }
        ClosePopupsOverWindow(pIVar27,false);
        FocusWindow(pIVar27);
        if (pIVar27->NavLastIds[0] == 0) {
          NavInitWindow(pIVar27,false);
        }
        if ((pIVar27->DC).NavLayerActiveMask == 2) {
          pIVar19->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar19->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if (((char)uVar28 != '\0') &&
       (pIVar25 = pIVar19->NavWindow, pIVar27 = pIVar25, pIVar25 != (ImGuiWindow *)0x0)) {
      while (window = pIVar27, window->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar27 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
      }
      if (window != pIVar25) {
        FocusWindow(window);
        window->NavLastChildNavWindow = pIVar25;
      }
      pIVar19->NavDisableHighlight = false;
      pIVar19->NavDisableMouseHover = true;
      IVar33 = ImGuiNavLayer_Main;
      if (((pIVar19->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
        IVar33 = pIVar19->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar33);
    }
  }
  else {
    pIVar19->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((((uVar38 & 1) == 0 & (bVar35 ^ 1)) == 0) && (pIVar18->NavWindow != (ImGuiWindow *)0x0)) {
    bVar37 = (pIVar18->NavWindow->Flags & 0x40000U) == 0;
    (pIVar18->IO).NavActive = bVar37;
    if (((!bVar37) || (pIVar18->NavId == 0)) ||
       (bVar37 = true, pIVar18->NavDisableHighlight != false)) goto LAB_00120fa3;
  }
  else {
    (pIVar18->IO).NavActive = false;
LAB_00120fa3:
    bVar37 = pIVar18->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  (pIVar18->IO).NavVisible = bVar37;
  pIVar36 = GImGui;
  fVar40 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar40 == 0.0) && (!NAN(fVar40))) {
    if (pIVar18->ActiveId == 0) {
      pIVar25 = pIVar18->NavWindow;
      if (((pIVar25 == (ImGuiWindow *)0x0) || ((pIVar25->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar25->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar23 = (pIVar18->OpenPopupStack).Size;
        if ((long)iVar23 < 1) {
          if (pIVar18->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar25 != (ImGuiWindow *)0x0) && ((pIVar25->Flags & 0x5000000U) != 0x1000000)) {
              pIVar25->NavLastIds[0] = 0;
            }
            pIVar18->NavId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar18->OpenPopupStack).Data[(long)iVar23 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar23 + -1,true);
        }
      }
      else {
        if (pIVar25->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                        ,0x1ed4,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar25->ParentWindow);
        ppIVar12 = &GImGui->NavWindow;
        if (*ppIVar12 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                        ,0xa5e,"void ImGui::SetNavID(ImGuiID, int)");
        }
        IVar8 = pIVar25->ChildId;
        GImGui->NavId = IVar8;
        (*ppIVar12)->NavLastIds[0] = IVar8;
        pIVar18->NavIdIsAlive = false;
        if (pIVar18->NavDisableMouseHover == true) {
          pIVar18->NavMousePosDirty = true;
        }
      }
    }
    else if ((pIVar18->ActiveIdBlockNavInputFlags & 2) == 0) {
      bVar37 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar37;
      if (bVar37) {
        pIVar36->ActiveIdTimer = 0.0;
        pIVar36->ActiveIdHasBeenPressed = false;
        pIVar36->ActiveIdHasBeenEdited = false;
      }
      pIVar36->ActiveId = 0;
      pIVar36->ActiveIdAllowNavDirFlags = 0;
      pIVar36->ActiveIdBlockNavInputFlags = 0;
      pIVar36->ActiveIdAllowOverlap = false;
      pIVar36->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar18->NavActivateId = 0;
  pIVar18->NavActivateDownId = 0;
  pIVar18->NavActivatePressedId = 0;
  pIVar36 = GImGui;
  pIVar18->NavInputId = 0;
  IVar8 = pIVar18->NavId;
  if ((((IVar8 != 0) && (pIVar18->NavDisableHighlight == false)) &&
      (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar18->NavWindow != (ImGuiWindow *)0x0 && ((pIVar18->NavWindow->Flags & 0x40000) == 0)))) {
    fVar40 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar40) {
      bVar37 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar37 = false;
    }
    IVar10 = pIVar18->ActiveId;
    if (bVar37 && IVar10 == 0) {
      pIVar18->NavActivateId = IVar8;
    }
    if (IVar10 == 0) {
      if (0.0 < fVar40) goto LAB_001221ce;
    }
    else if (IVar10 == IVar8 && 0.0 < fVar40) {
LAB_001221ce:
      pIVar18->NavActivateDownId = IVar8;
    }
    if (IVar10 == 0) {
      if (bVar37) goto LAB_001221e4;
    }
    else if ((bool)(bVar37 & IVar10 == IVar8)) {
LAB_001221e4:
      pIVar18->NavActivatePressedId = IVar8;
    }
    if (((IVar10 == 0 || IVar10 == IVar8) &&
        (fVar40 = (pIVar36->IO).NavInputsDownDuration[2], fVar40 == 0.0)) && (!NAN(fVar40))) {
      pIVar18->NavInputId = IVar8;
    }
  }
  pIVar25 = pIVar18->NavWindow;
  if ((pIVar25 != (ImGuiWindow *)0x0) && ((pIVar25->Flags & 0x40000) != 0)) {
    pIVar18->NavDisableHighlight = true;
  }
  IVar8 = pIVar18->NavActivateId;
  if ((IVar8 != 0) && (pIVar18->NavActivateDownId != IVar8)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x1f01,"void ImGui::NavUpdate()");
  }
  pIVar18->NavMoveRequest = false;
  IVar8 = pIVar18->NavNextActivateId;
  if (IVar8 != 0) {
    pIVar18->NavInputId = IVar8;
    pIVar18->NavActivatePressedId = IVar8;
    pIVar18->NavActivateDownId = IVar8;
    pIVar18->NavActivateId = IVar8;
  }
  pIVar18->NavNextActivateId = 0;
  if (pIVar18->ActiveId == 0) {
    uVar39 = 0xffffffff;
  }
  else {
    uVar39 = pIVar18->ActiveIdAllowNavDirFlags;
  }
  if (pIVar18->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar18->NavMoveDir = -1;
    pIVar18->NavMoveRequestFlags = 0;
    if (((pIVar25 != (ImGuiWindow *)0x0) &&
        (uVar39 != 0 && pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar25->Flags & 0x40000) == 0)) {
      if ((uVar39 & 1) != 0) {
        fVar40 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat);
        fVar48 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar48 + fVar40) {
          pIVar18->NavMoveDir = 0;
        }
      }
      if ((uVar39 & 2) != 0) {
        fVar40 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat);
        fVar48 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar48 + fVar40) {
          pIVar18->NavMoveDir = 1;
        }
      }
      if ((uVar39 & 4) != 0) {
        fVar40 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat);
        fVar48 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar48 + fVar40) {
          pIVar18->NavMoveDir = 2;
        }
      }
      if ((uVar39 & 8) != 0) {
        fVar40 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat);
        fVar48 = GetNavInputAmount(0x15,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar48 + fVar40) {
          pIVar18->NavMoveDir = 3;
        }
      }
    }
    pIVar18->NavMoveClipDir = pIVar18->NavMoveDir;
  }
  else {
    if ((pIVar18->NavMoveDir == -1) || (pIVar18->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1f1c,"void ImGui::NavUpdate()");
    }
    if (pIVar18->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1f1d,"void ImGui::NavUpdate()");
    }
    pIVar18->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar36 = GImGui;
  fVar40 = 0.0;
  if ((uVar38 & 1) != 0) {
    if (((GImGui->NavMoveDir == -1) && (pIVar25 = GImGui->NavWindow, pIVar25 != (ImGuiWindow *)0x0))
       && (((pIVar25->Flags & 0x40000) == 0 &&
           ((GImGui->NavWindowingTarget == (ImGuiWindow *)0x0 &&
            (GImGui->NavLayer == ImGuiNavLayer_Main)))))) {
      bVar20 = IsKeyDown((GImGui->IO).KeyMap[5]);
      bVar21 = IsKeyDown((pIVar36->IO).KeyMap[6]);
      bVar37 = true;
      if (((byte)uVar39 >> 2 & bVar20) != ((byte)uVar39 >> 3 & bVar21)) {
        if (((pIVar25->DC).NavLayerActiveMask == 0) && ((pIVar25->DC).NavHasScroll == true)) {
          bVar37 = IsKeyPressed((pIVar36->IO).KeyMap[5],true);
          if (bVar37) {
            fVar48 = (pIVar25->Scroll).y;
            fVar41 = (pIVar25->DC).CursorMaxPos.y;
            fVar42 = fVar48 - ((pIVar25->InnerMainRect).Max.y - (pIVar25->InnerMainRect).Min.y);
            (pIVar25->Scroll).y = fVar42;
            fVar42 = (fVar48 + fVar41) - fVar42;
LAB_0012279f:
            (pIVar25->DC).CursorMaxPos.y = fVar42;
          }
          else {
            bVar37 = IsKeyPressed((pIVar36->IO).KeyMap[6],true);
            if (bVar37) {
              fVar48 = (pIVar25->Scroll).y;
              fVar42 = ((pIVar25->InnerMainRect).Max.y - (pIVar25->InnerMainRect).Min.y) + fVar48;
              fVar41 = (pIVar25->DC).CursorMaxPos.y;
              (pIVar25->Scroll).y = fVar42;
              fVar42 = (fVar48 + fVar41) - fVar42;
              goto LAB_0012279f;
            }
          }
          bVar37 = true;
        }
        else {
          fVar40 = (pIVar25->NavRectRel[pIVar36->NavLayer].Max.y -
                   pIVar25->NavRectRel[pIVar36->NavLayer].Min.y) +
                   (((pIVar25->InnerMainRect).Max.y - (pIVar25->InnerMainRect).Min.y) -
                   GImGui->FontBaseSize * pIVar25->FontWindowScale);
          fVar40 = (float)(~-(uint)(fVar40 <= 0.0) & (uint)fVar40);
          bVar37 = IsKeyPressed((pIVar36->IO).KeyMap[5],true);
          if (bVar37) {
            fVar40 = -fVar40;
            pIVar36->NavMoveDir = 3;
            pIVar36->NavMoveClipDir = 2;
            pIVar36->NavMoveRequestFlags = 0x30;
            bVar37 = false;
          }
          else {
            bVar37 = IsKeyPressed((pIVar36->IO).KeyMap[6],true);
            if (bVar37) {
              pIVar36->NavMoveDir = 2;
              pIVar36->NavMoveClipDir = 3;
              pIVar36->NavMoveRequestFlags = 0x30;
              bVar37 = false;
            }
            else {
              bVar37 = false;
              fVar40 = 0.0;
            }
          }
        }
      }
      if (!bVar37) goto LAB_001213fd;
    }
    fVar40 = 0.0;
  }
LAB_001213fd:
  uVar38 = pIVar18->NavMoveDir;
  if (uVar38 != 0xffffffff) {
    pIVar18->NavMoveRequest = true;
    pIVar18->NavMoveDirLast = uVar38;
  }
  bVar37 = pIVar18->NavMoveRequest;
  if ((bVar37 == true) && (pIVar18->NavId == 0)) {
    pIVar18->NavInitRequest = true;
    pIVar18->NavInitRequestFromMove = true;
    pIVar18->NavInitResultId = 0;
    pIVar18->NavDisableHighlight = false;
  }
  pIVar36 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar4 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar4;
    if (*pbVar4 != false) goto LAB_00121475;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_00121475:
    if (pIVar36->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                    ,0x1def,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar25 = pIVar18->NavWindow;
  if (((pIVar25 != (ImGuiWindow *)0x0) && ((pIVar25->Flags & 0x40000) == 0)) &&
     (pIVar18->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar48 = (float)(int)(pIVar36->FontBaseSize * pIVar25->FontWindowScale * 100.0 *
                          (pIVar18->IO).DeltaTime + 0.5);
    if (((pIVar25->DC).NavLayerActiveMask == 0) && (((pIVar25->DC).NavHasScroll & bVar37) == 1)) {
      if (uVar38 < 2) {
        fVar41 = (pIVar25->Scroll).x;
        fVar42 = (pIVar25->DC).CursorMaxPos.x;
        fVar47 = (float)(int)(*(float *)(&DAT_00199a58 + (ulong)(uVar38 == 0) * 4) * fVar48 + fVar41
                             );
        (pIVar25->Scroll).x = fVar47;
        (pIVar25->DC).CursorMaxPos.x = (fVar41 + fVar42) - fVar47;
      }
      if ((uVar38 & 0xfffffffe) == 2) {
        fVar41 = (pIVar25->Scroll).y;
        fVar42 = (pIVar25->DC).CursorMaxPos.y;
        fVar47 = (float)(int)(*(float *)(&DAT_00199a58 + (ulong)(uVar38 == 2) * 4) * fVar48 + fVar41
                             );
        (pIVar25->Scroll).y = fVar47;
        (pIVar25->DC).CursorMaxPos.y = (fVar41 + fVar42) - fVar47;
      }
    }
    IVar43 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar41 = IVar43.x;
    if (((fVar41 != 0.0) || (NAN(fVar41))) && (pIVar25->ScrollbarX == true)) {
      fVar42 = (pIVar25->Scroll).x;
      fVar47 = (float)(int)(fVar41 * fVar48 + fVar42);
      fVar41 = (pIVar25->DC).CursorMaxPos.x;
      (pIVar25->Scroll).x = fVar47;
      (pIVar25->DC).CursorMaxPos.x = (fVar42 + fVar41) - fVar47;
      pIVar18->NavMoveFromClampedRefRect = true;
    }
    fVar41 = IVar43.y;
    if ((fVar41 != 0.0) || (NAN(fVar41))) {
      fVar42 = (pIVar25->Scroll).y;
      fVar41 = (float)(int)(fVar41 * fVar48 + fVar42);
      fVar48 = (pIVar25->DC).CursorMaxPos.y;
      (pIVar25->Scroll).y = fVar41;
      (pIVar25->DC).CursorMaxPos.y = (fVar42 + fVar48) - fVar41;
      pIVar18->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar18->NavMoveResultLocal).ID = 0;
  (pIVar18->NavMoveResultLocal).SelectScopeId = 0;
  (pIVar18->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar18->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar18->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar18->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar18->NavMoveResultLocal).RectRel.Min.x = 3.4028235e+38;
  (pIVar18->NavMoveResultLocal).RectRel.Min.y = 3.4028235e+38;
  (pIVar18->NavMoveResultLocal).RectRel.Max.x = -3.4028235e+38;
  (pIVar18->NavMoveResultLocal).RectRel.Max.y = -3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar18->NavMoveResultLocalVisibleSet).SelectScopeId = 0;
  (pIVar18->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar18->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).RectRel.Min.x = 3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).RectRel.Min.y = 3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).RectRel.Max.x = -3.4028235e+38;
  (pIVar18->NavMoveResultLocalVisibleSet).RectRel.Max.y = -3.4028235e+38;
  (pIVar18->NavMoveResultOther).ID = 0;
  (pIVar18->NavMoveResultOther).SelectScopeId = 0;
  (pIVar18->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar18->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar18->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar18->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar18->NavMoveResultOther).RectRel.Min.x = 3.4028235e+38;
  (pIVar18->NavMoveResultOther).RectRel.Min.y = 3.4028235e+38;
  (pIVar18->NavMoveResultOther).RectRel.Max.x = -3.4028235e+38;
  (pIVar18->NavMoveResultOther).RectRel.Max.y = -3.4028235e+38;
  if (((bVar37 != false) && (pIVar18->NavMoveFromClampedRefRect == true)) &&
     (pIVar18->NavLayer == ImGuiNavLayer_Main)) {
    fVar48 = (pIVar25->Pos).x;
    fVar41 = (pIVar25->Pos).y;
    fVar49 = ((pIVar25->InnerMainRect).Min.x - fVar48) + -1.0;
    fVar47 = ((pIVar25->InnerMainRect).Min.y - fVar41) + -1.0;
    fVar42 = ((pIVar25->InnerMainRect).Max.x - fVar48) + 1.0;
    fVar41 = ((pIVar25->InnerMainRect).Max.y - fVar41) + 1.0;
    fVar48 = pIVar25->NavRectRel[0].Min.x;
    if (((fVar48 < fVar49) || (pIVar25->NavRectRel[0].Min.y < fVar47)) ||
       ((fVar42 < pIVar25->NavRectRel[0].Max.x || (fVar41 < pIVar25->NavRectRel[0].Max.y)))) {
      fVar51 = pIVar36->FontBaseSize * pIVar25->FontWindowScale * 0.5;
      fVar52 = fVar42 - fVar49;
      if (fVar51 <= fVar42 - fVar49) {
        fVar52 = fVar51;
      }
      fVar53 = fVar41 - fVar47;
      if (fVar51 <= fVar41 - fVar47) {
        fVar53 = fVar51;
      }
      uVar38 = -(uint)(fVar49 + fVar52 <= fVar48);
      fVar51 = pIVar25->NavRectRel[0].Min.y;
      fVar7 = pIVar25->NavRectRel[0].Max.x;
      uVar39 = -(uint)(fVar47 + fVar53 <= fVar51);
      pIVar25->NavRectRel[0].Min.x =
           (float)(uVar38 & (uint)fVar48 | ~uVar38 & (uint)(fVar49 + fVar52));
      pIVar25->NavRectRel[0].Min.y =
           (float)(uVar39 & (uint)fVar51 | ~uVar39 & (uint)(fVar47 + fVar53));
      if (fVar42 - fVar52 <= fVar7) {
        fVar7 = fVar42 - fVar52;
      }
      fVar48 = pIVar25->NavRectRel[0].Max.y;
      if (fVar41 - fVar53 <= fVar48) {
        fVar48 = fVar41 - fVar53;
      }
      IVar50.y = fVar48;
      IVar50.x = fVar7;
      pIVar25->NavRectRel[0].Max = IVar50;
      pIVar18->NavId = 0;
    }
    pIVar18->NavMoveFromClampedRefRect = false;
  }
  pIVar25 = pIVar18->NavWindow;
  if (pIVar25 != (ImGuiWindow *)0x0) {
    IVar33 = pIVar18->NavLayer;
    fVar48 = pIVar25->NavRectRel[IVar33].Min.x;
    fVar41 = pIVar25->NavRectRel[IVar33].Max.x;
    if (fVar48 <= fVar41) {
      fVar42 = pIVar25->NavRectRel[IVar33].Min.y;
      fVar47 = pIVar25->NavRectRel[IVar33].Max.y;
      if (fVar42 <= fVar47) goto LAB_0012188b;
    }
  }
  fVar47 = 0.0;
  fVar41 = 0.0;
  fVar42 = 0.0;
  fVar48 = 0.0;
LAB_0012188b:
  if (pIVar25 == (ImGuiWindow *)0x0) {
    fVar41 = (GImGui->IO).DisplaySize.x;
    fVar47 = (GImGui->IO).DisplaySize.y;
    fVar48 = 0.0;
    fVar42 = 0.0;
  }
  else {
    fVar49 = (pIVar25->Pos).x;
    fVar52 = (pIVar25->Pos).y;
    fVar48 = fVar48 + fVar49;
    fVar42 = fVar42 + fVar52;
    fVar41 = fVar41 + fVar49;
    fVar47 = fVar47 + fVar52;
  }
  (pIVar18->NavScoringRectScreen).Min.x = fVar48;
  (pIVar18->NavScoringRectScreen).Min.y = fVar42;
  (pIVar18->NavScoringRectScreen).Max.x = fVar41;
  (pIVar18->NavScoringRectScreen).Max.y = fVar47;
  fVar42 = (pIVar18->NavScoringRectScreen).Min.y + fVar40;
  (pIVar18->NavScoringRectScreen).Min.y = fVar42;
  fVar40 = fVar40 + (pIVar18->NavScoringRectScreen).Max.y;
  (pIVar18->NavScoringRectScreen).Max.y = fVar40;
  fVar41 = (pIVar18->NavScoringRectScreen).Min.x + 1.0;
  fVar48 = (pIVar18->NavScoringRectScreen).Max.x;
  if (fVar48 <= fVar41) {
    fVar41 = fVar48;
  }
  (pIVar18->NavScoringRectScreen).Min.x = fVar41;
  (pIVar18->NavScoringRectScreen).Max.x = fVar41;
  if (fVar40 < fVar42) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x1f6b,"void ImGui::NavUpdate()");
  }
  pIVar18->NavScoringCount = 0;
  pIVar18 = GImGui;
  pIVar6 = &(GImGui->IO).MousePos;
  bVar37 = IsMousePosValid(pIVar6);
  if (bVar37) {
    IVar44.x = (float)(int)(pIVar18->IO).MousePos.x;
    IVar44.y = (float)(int)(pIVar18->IO).MousePos.y;
    pIVar18->LastValidMousePos = IVar44;
    (pIVar18->IO).MousePos = IVar44;
  }
  bVar37 = IsMousePosValid(pIVar6);
  if ((bVar37) && (bVar37 = IsMousePosValid(&(pIVar18->IO).MousePosPrev), bVar37)) {
    IVar45.x = (pIVar18->IO).MousePos.x - (pIVar18->IO).MousePosPrev.x;
    IVar45.y = (pIVar18->IO).MousePos.y - (pIVar18->IO).MousePosPrev.y;
    (pIVar18->IO).MouseDelta = IVar45;
  }
  else {
    (pIVar18->IO).MouseDelta.x = 0.0;
    (pIVar18->IO).MouseDelta.y = 0.0;
  }
  if ((((pIVar18->IO).MouseDelta.x != 0.0) || (fVar40 = (pIVar18->IO).MouseDelta.y, fVar40 != 0.0))
     || (NAN(fVar40))) {
    pIVar18->NavDisableMouseHover = false;
  }
  (pIVar18->IO).MousePosPrev = (pIVar18->IO).MousePos;
  lVar24 = -5;
  do {
    fVar40 = -1.0;
    bVar37 = (pIVar18->IO).MouseDown[lVar24 + 5];
    if (bVar37 == true) {
      pfVar2 = (pIVar18->IO).MouseDownDurationPrev + lVar24;
      bVar20 = *pfVar2 <= 0.0 && *pfVar2 != 0.0;
    }
    else {
      bVar20 = false;
    }
    (pIVar18->IO).MouseDoubleClicked[lVar24] = bVar20;
    if (bVar37 == false) {
      bVar21 = 0.0 <= (pIVar18->IO).MouseDownDurationPrev[lVar24];
    }
    else {
      bVar21 = false;
    }
    (pIVar18->IO).MouseDownOwned[lVar24] = bVar21;
    fVar48 = (pIVar18->IO).MouseDownDurationPrev[lVar24];
    (&(pIVar18->IO).MouseDragMaxDistanceAbs[0].x)[lVar24] = fVar48;
    if ((bVar37 != false) && (fVar40 = 0.0, 0.0 <= fVar48)) {
      fVar40 = fVar48 + (pIVar18->IO).DeltaTime;
    }
    (pIVar18->IO).MouseDownDurationPrev[lVar24] = fVar40;
    (pIVar18->IO).MouseReleased[lVar24] = false;
    if (bVar20 == false) {
      if (bVar37 != false) {
        bVar37 = IsMousePosValid(pIVar6);
        fVar40 = 0.0;
        fVar48 = 0.0;
        if (bVar37) {
          fVar40 = (pIVar18->IO).MousePos.x -
                   *(float *)((long)(pIVar18->IO).MouseClickedTime + lVar24 * 8 + -4);
          fVar48 = (pIVar18->IO).MousePos.y - *(float *)((pIVar18->IO).MouseClickedTime + lVar24);
        }
        fVar41 = (pIVar18->IO).KeysDownDuration[lVar24];
        fVar42 = -fVar48;
        if (-fVar48 <= fVar48) {
          fVar42 = fVar48;
        }
        fVar48 = fVar40 * fVar40 + fVar48 * fVar48;
        uVar38 = -(uint)(fVar48 <= fVar41);
        (pIVar18->IO).KeysDownDuration[lVar24] =
             (float)(~uVar38 & (uint)fVar48 | (uint)fVar41 & uVar38);
        fVar48 = -fVar40;
        if (-fVar40 <= fVar40) {
          fVar48 = fVar40;
        }
        fVar40 = (pIVar18->IO).MouseDragMaxDistanceSqr[lVar24 * 2];
        fVar41 = (pIVar18->IO).MouseDragMaxDistanceSqr[lVar24 * 2 + 1];
        uVar38 = -(uint)(fVar48 <= fVar40);
        (pIVar18->IO).MouseDragMaxDistanceSqr[lVar24 * 2] =
             (float)(~uVar38 & (uint)fVar48 | (uint)fVar40 & uVar38);
        uVar38 = -(uint)(fVar42 <= fVar41);
        (pIVar18->IO).MouseDragMaxDistanceSqr[lVar24 * 2 + 1] =
             (float)(~uVar38 & (uint)fVar42 | (uint)fVar41 & uVar38);
      }
    }
    else {
      dVar46 = pIVar18->Time;
      if ((float)(dVar46 - *(double *)((pIVar18->IO).MouseClicked + lVar24 * 8)) <
          (pIVar18->IO).MouseDoubleClickTime) {
        bVar37 = IsMousePosValid(pIVar6);
        fVar40 = 0.0;
        fVar48 = 0.0;
        if (bVar37) {
          fVar40 = (pIVar18->IO).MousePos.x -
                   *(float *)((long)(pIVar18->IO).MouseClickedTime + lVar24 * 8 + -4);
          fVar48 = (pIVar18->IO).MousePos.y - *(float *)((pIVar18->IO).MouseClickedTime + lVar24);
        }
        fVar41 = (pIVar18->IO).MouseDoubleClickMaxDist;
        dVar46 = -3.4028234663852886e+38;
        if (fVar40 * fVar40 + fVar48 * fVar48 < fVar41 * fVar41) {
          (pIVar18->IO).MouseReleased[lVar24] = true;
          dVar46 = -3.4028234663852886e+38;
        }
      }
      *(double *)((pIVar18->IO).MouseClicked + lVar24 * 8) = dVar46;
      *(ImVec2 *)((long)(pIVar18->IO).MouseClickedTime + lVar24 * 8 + -4) = (pIVar18->IO).MousePos;
      *(bool *)((long)(pIVar18->IO).MouseDownDuration + lVar24 + -3) =
           (pIVar18->IO).MouseReleased[lVar24];
      pfVar2 = (pIVar18->IO).MouseDragMaxDistanceSqr + lVar24 * 2;
      pfVar2[0] = 0.0;
      pfVar2[1] = 0.0;
      (pIVar18->IO).KeysDownDuration[lVar24] = 0.0;
    }
    if (((pIVar18->IO).MouseDown[lVar24 + 5] == false) &&
       ((pIVar18->IO).MouseDownOwned[lVar24] == false)) {
      *(undefined1 *)((long)(pIVar18->IO).MouseDownDuration + lVar24 + -3) = 0;
    }
    if ((pIVar18->IO).MouseDoubleClicked[lVar24] == true) {
      pIVar18->NavDisableMouseHover = false;
    }
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0);
  fVar40 = (pIVar17->IO).DeltaTime;
  iVar23 = pIVar17->FramerateSecPerFrameIdx;
  pIVar17->FramerateSecPerFrameAccum =
       (fVar40 - pIVar17->FramerateSecPerFrame[iVar23]) + pIVar17->FramerateSecPerFrameAccum;
  pIVar17->FramerateSecPerFrame[iVar23] = fVar40;
  iVar22 = iVar23 + (int)((ulong)((long)(iVar23 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar17->FramerateSecPerFrameIdx = iVar23 + 1 + ((iVar22 >> 6) - (iVar22 >> 0x1f)) * -0x78;
  uVar38 = -(uint)(0.0 < pIVar17->FramerateSecPerFrameAccum);
  (pIVar17->IO).Framerate =
       (float)(~uVar38 & 0x7f7fffff |
              (uint)(1.0 / (pIVar17->FramerateSecPerFrameAccum / 120.0)) & uVar38);
  UpdateMouseMovingWindowNewFrame();
  UpdateHoveredWindowAndCaptureFlags();
  pIVar25 = GetFrontMostPopupModal();
  if ((pIVar25 != (ImGuiWindow *)0x0) ||
     ((pIVar17->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar17->NavWindowingHighlightAlpha)))) {
    fVar40 = (pIVar17->IO).DeltaTime * 6.0 + pIVar17->DimBgRatio;
    if (1.0 <= fVar40) {
      fVar40 = 1.0;
    }
    pIVar17->DimBgRatio = fVar40;
  }
  else {
    fVar40 = (pIVar17->IO).DeltaTime * -10.0 + pIVar17->DimBgRatio;
    pIVar17->DimBgRatio = (float)(-(uint)(0.0 <= fVar40) & (uint)fVar40);
  }
  pIVar17->MouseCursor = 0;
  pIVar17->WantTextInputNextFrame = -1;
  pIVar17->WantCaptureMouseNextFrame = -1;
  pIVar17->WantCaptureKeyboardNextFrame = -1;
  (pIVar17->PlatformImePos).x = 1.0;
  pIVar18 = GImGui;
  (pIVar17->PlatformImePos).y = 1.0;
  pIVar25 = GImGui->HoveredWindow;
  if ((pIVar25 != (ImGuiWindow *)0x0) && (pIVar25->Collapsed == false)) {
    fVar40 = (GImGui->IO).MouseWheel;
    if ((fVar40 != 0.0) ||
       (((NAN(fVar40) || (fVar48 = (GImGui->IO).MouseWheelH, fVar48 != 0.0)) || (NAN(fVar48))))) {
      if ((((fVar40 == 0.0) && (!NAN(fVar40))) || ((GImGui->IO).KeyCtrl != true)) ||
         ((GImGui->IO).FontAllowUserScaling != true)) {
        do {
          pIVar27 = pIVar25;
          if ((pIVar27->Flags & 0x1000218U) != 0x1000010) break;
          pIVar25 = pIVar27->ParentWindow;
        } while (pIVar27->ParentWindow != (ImGuiWindow *)0x0);
        if (((pIVar27->Flags & 0x210U) == 0) &&
           ((((fVar40 != 0.0 || (NAN(fVar40))) ||
             ((fVar48 = (GImGui->IO).MouseWheelH, fVar48 != 0.0 || (NAN(fVar48))))) &&
            ((GImGui->IO).KeyCtrl == false)))) {
          fVar48 = (pIVar27->WindowPadding).x;
          fVar48 = (fVar48 + fVar48 +
                   ((pIVar27->ContentsRegionRect).Max.x - (pIVar27->ContentsRegionRect).Min.x)) *
                   0.67;
          if ((fVar40 != 0.0) || (NAN(fVar40))) {
            fVar41 = GImGui->FontBaseSize * pIVar27->FontWindowScale;
            if ((GImGui->IO).KeyShift == false) {
              fVar42 = (pIVar27->WindowPadding).y;
              fVar47 = (fVar42 + fVar42 +
                       ((pIVar27->ContentsRegionRect).Max.y - (pIVar27->ContentsRegionRect).Min.y))
                       * 0.67;
              fVar42 = fVar41 * 5.0;
              if (fVar47 <= fVar41 * 5.0) {
                fVar42 = fVar47;
              }
              fVar41 = (pIVar27->Scroll).y;
              fVar42 = -fVar40 * (float)(int)fVar42 + fVar41;
              fVar40 = (pIVar27->DC).CursorMaxPos.y;
              (pIVar27->Scroll).y = fVar42;
              (pIVar27->DC).CursorMaxPos.y = (fVar41 + fVar40) - fVar42;
            }
            else {
              fVar42 = fVar41 + fVar41;
              if (fVar48 <= fVar41 + fVar41) {
                fVar42 = fVar48;
              }
              fVar41 = (pIVar27->Scroll).x;
              fVar42 = -fVar40 * (float)(int)fVar42 + fVar41;
              fVar40 = (pIVar27->DC).CursorMaxPos.x;
              (pIVar27->Scroll).x = fVar42;
              (pIVar27->DC).CursorMaxPos.x = (fVar41 + fVar40) - fVar42;
            }
          }
          fVar40 = (pIVar18->IO).MouseWheelH;
          if (((fVar40 != 0.0) || (NAN(fVar40))) && ((pIVar18->IO).KeyShift == false)) {
            fVar41 = pIVar18->FontBaseSize * pIVar27->FontWindowScale;
            fVar41 = fVar41 + fVar41;
            if (fVar48 <= fVar41) {
              fVar41 = fVar48;
            }
            fVar48 = (pIVar27->Scroll).x;
            fVar42 = (pIVar27->DC).CursorMaxPos.x;
            fVar40 = fVar48 - fVar40 * (float)(int)fVar41;
            (pIVar27->Scroll).x = fVar40;
            (pIVar27->DC).CursorMaxPos.x = (fVar48 + fVar42) - fVar40;
          }
        }
      }
      else {
        fVar48 = pIVar25->FontWindowScale;
        fVar41 = fVar40 * 0.1 + fVar48;
        fVar40 = 2.5;
        if (fVar41 <= 2.5) {
          fVar40 = fVar41;
        }
        fVar40 = (float)(-(uint)(fVar41 < 0.5) & 0x3f000000 | ~-(uint)(fVar41 < 0.5) & (uint)fVar40)
        ;
        pIVar25->FontWindowScale = fVar40;
        if ((pIVar25->Flags & 0x1000000) == 0) {
          fVar40 = fVar40 / fVar48;
          fVar48 = (pIVar25->Size).x;
          fVar41 = (pIVar25->Size).y;
          fVar42 = (pIVar25->Pos).x;
          fVar47 = (pIVar25->Pos).y;
          IVar16.y = (float)(int)((((pIVar18->IO).MousePos.y - fVar47) * (1.0 - fVar40) * fVar41) /
                                  fVar41 + fVar47);
          IVar16.x = (float)(int)((((pIVar18->IO).MousePos.x - fVar42) * (1.0 - fVar40) * fVar48) /
                                  fVar48 + fVar42);
          pIVar25->Pos = IVar16;
          IVar14.y = (float)(int)(fVar41 * fVar40);
          IVar14.x = (float)(int)(fVar48 * fVar40);
          pIVar25->Size = IVar14;
          IVar15.y = (float)(int)(fVar40 * (pIVar25->SizeFull).y);
          IVar15.x = (float)(int)((pIVar25->SizeFull).x * fVar40);
          pIVar25->SizeFull = IVar15;
        }
      }
    }
  }
  pIVar25 = pIVar17->NavWindow;
  if (((pIVar25 == (ImGuiWindow *)0x0) || (pIVar25->Active != true)) ||
     (((pIVar25->Flags & 0x40000) != 0 ||
      (((pIVar17->IO).KeyCtrl != false || (iVar23 = (pIVar18->IO).KeyMap[0], iVar23 < 0)))))) {
    bVar37 = false;
  }
  else {
    bVar37 = IsKeyPressed(iVar23,true);
  }
  pIVar17->FocusTabPressed = bVar37;
  if ((bVar37 != false) && (pIVar17->ActiveId == 0)) {
    pIVar17->FocusRequestNextWindow = pIVar17->NavWindow;
    pIVar17->FocusRequestNextCounterAll = 0x7fffffff;
    if ((pIVar17->NavId == 0) || (pIVar17->NavIdTabCounter == 0x7fffffff)) {
      iVar23 = -(uint)(pIVar17->IO).KeyShift;
    }
    else {
      iVar23 = pIVar17->NavIdTabCounter + (-(uint)(pIVar17->IO).KeyShift | 1) + 1;
    }
    pIVar17->FocusRequestNextCounterTab = iVar23;
  }
  pIVar17->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar17->FocusRequestCurrCounterAll = 0x7fffffff;
  pIVar17->FocusRequestCurrCounterTab = 0x7fffffff;
  pIVar25 = pIVar17->FocusRequestNextWindow;
  if (pIVar25 != (ImGuiWindow *)0x0) {
    pIVar17->FocusRequestCurrWindow = pIVar25;
    if ((pIVar17->FocusRequestNextCounterAll != 0x7fffffff) &&
       (iVar23 = (pIVar25->DC).FocusCounterAll, iVar23 != -1)) {
      pIVar17->FocusRequestCurrCounterAll =
           (pIVar17->FocusRequestNextCounterAll + iVar23 + 1) % (iVar23 + 1);
    }
    if ((pIVar17->FocusRequestNextCounterTab != 0x7fffffff) &&
       (iVar23 = (pIVar25->DC).FocusCounterTab, iVar23 != -1)) {
      pIVar17->FocusRequestCurrCounterTab =
           (pIVar17->FocusRequestNextCounterTab + iVar23 + 1) % (iVar23 + 1);
    }
    pIVar17->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar17->FocusRequestNextCounterAll = 0x7fffffff;
    pIVar17->FocusRequestNextCounterTab = 0x7fffffff;
  }
  pIVar17->NavIdTabCounter = 0x7fffffff;
  uVar38 = (pIVar17->Windows).Size;
  if ((pIVar17->WindowsFocusOrder).Size != uVar38) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0xe15,"void ImGui::NewFrame()");
  }
  if ((ulong)uVar38 != 0) {
    uVar28 = 0;
    if (0 < (int)uVar38) {
      uVar28 = (ulong)uVar38;
    }
    uVar32 = 0;
    do {
      if (uVar28 == uVar32) {
        pcVar26 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_001227eb;
      }
      pIVar25 = (pIVar17->Windows).Data[uVar32];
      pIVar25->WasActive = pIVar25->Active;
      pIVar25->BeginCount = 0;
      pIVar25->Active = false;
      pIVar25->WriteAccessed = false;
      uVar32 = uVar32 + 1;
    } while (uVar38 != uVar32);
  }
  if ((pIVar17->NavWindow != (ImGuiWindow *)0x0) && (pIVar17->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar23 = (pIVar17->CurrentWindowStack).Capacity;
  if (iVar23 < 0) {
    uVar38 = iVar23 / 2 + iVar23;
    uVar28 = 0;
    if (0 < (int)uVar38) {
      uVar28 = (ulong)uVar38;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar5 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar5 = *piVar5 + 1;
    }
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar28 * 8,GImAllocatorUserData);
    ppIVar12 = (pIVar17->CurrentWindowStack).Data;
    if (ppIVar12 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar12,(long)(pIVar17->CurrentWindowStack).Size << 3);
      ppIVar12 = (pIVar17->CurrentWindowStack).Data;
      if ((ppIVar12 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar5 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar12,GImAllocatorUserData);
    }
    (pIVar17->CurrentWindowStack).Data = __dest;
    (pIVar17->CurrentWindowStack).Capacity = (int)uVar28;
  }
  (pIVar17->CurrentWindowStack).Size = 0;
  iVar23 = (pIVar17->BeginPopupStack).Capacity;
  if (iVar23 < 0) {
    uVar38 = iVar23 / 2 + iVar23;
    uVar28 = 0;
    if (0 < (int)uVar38) {
      uVar28 = (ulong)uVar38;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar5 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar5 = *piVar5 + 1;
    }
    __dest_00 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar28 * 0x30,GImAllocatorUserData);
    pIVar13 = (pIVar17->BeginPopupStack).Data;
    if (pIVar13 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_00,pIVar13,(long)(pIVar17->BeginPopupStack).Size * 0x30);
      pIVar13 = (pIVar17->BeginPopupStack).Data;
      if ((pIVar13 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar5 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar5 = *piVar5 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar13,GImAllocatorUserData);
    }
    (pIVar17->BeginPopupStack).Data = __dest_00;
    (pIVar17->BeginPopupStack).Capacity = (int)uVar28;
  }
  (pIVar17->BeginPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar17->NavWindow,false);
  pIVar18 = GImGui;
  (pIVar18->NextWindowData).SizeVal.x = 400.0;
  (pIVar18->NextWindowData).SizeVal.y = 400.0;
  (pIVar18->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  pIVar17->FrameScopePushedImplicitWindow = true;
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check user data
    // (We pass an error message in the assert expression to make it visible to programmers who are not using a debugger, as most assert handlers display their argument)
    IM_ASSERT(g.Initialized);
    IM_ASSERT((g.IO.DeltaTime > 0.0f || g.FrameCount == 0)              && "Need a positive DeltaTime!");
    IM_ASSERT((g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount)  && "Forgot to call Render() or EndFrame() at the end of the previous frame?");
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f  && "Invalid DisplaySize value!");
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0                                && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded()                          && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f                       && "Invalid style setting!");
    IM_ASSERT(g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f            && "Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!");
    IM_ASSERT(g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && "Invalid style setting.");
    for (int n = 0; n < ImGuiKey_COUNT; n++)
        IM_ASSERT(g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && "io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)");

    // Perform simple check: required key mapping (we intentionally do NOT check all keys to not pressure user into setting up everything, but Space is required and was only recently added in 1.60 WIP)
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
        IM_ASSERT(g.IO.KeyMap[ImGuiKey_Space] != -1 && "ImGuiKey_Space is not mapped, required for keyboard navigation.");

    // Perform simple check: the beta io.ConfigWindowsResizeFromEdges option requires back-end to honor mouse cursor changes and set the ImGuiBackendFlags_HasMouseCursors flag accordingly.
    if (g.IO.ConfigWindowsResizeFromEdges && !(g.IO.BackendFlags & ImGuiBackendFlags_HasMouseCursors))
        g.IO.ConfigWindowsResizeFromEdges = false;

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.FrameScopeActive = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();
    g.BackgroundDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();
    g.ForegroundDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEdited = g.ActiveIdHasBeenEdited;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();
    UpdateHoveredWindowAndCaptureFlags();

    // Background darkening/whitening
    if (GetFrontMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterAll = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTab = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTab = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterAll = g.FocusRequestCurrCounterTab = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterAll != INT_MAX && window->DC.FocusCounterAll != -1)
            g.FocusRequestCurrCounterAll = ImModPositive(g.FocusRequestNextCounterAll, window->DC.FocusCounterAll + 1);
        if (g.FocusRequestNextCounterTab != INT_MAX && window->DC.FocusCounterTab != -1)
            g.FocusRequestCurrCounterTab = ImModPositive(g.FocusRequestNextCounterTab, window->DC.FocusCounterTab + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterAll = g.FocusRequestNextCounterTab = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    g.FrameScopePushedImplicitWindow = true;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}